

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern
          (TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *this,void **vtt,TPZGeoMesh *DestMesh,
          TPZGeoElRefPattern<pzgeom::TPZGeoPyramid> *cp,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcNdMap,
          map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
          *gl2lcElMap)

{
  bool bVar1;
  long lVar2;
  int64_t iVar3;
  long *plVar4;
  ostream *poVar5;
  mapped_type_conflict *pmVar6;
  long in_RCX;
  long *in_RSI;
  long *in_RDI;
  stringstream sout;
  size_t in_stack_00000178;
  char *in_stack_00000180;
  int i;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffd58;
  TPZAutoPointer<TPZRefPattern> *in_stack_fffffffffffffd60;
  long *in_stack_fffffffffffffd80;
  int64_t in_stack_fffffffffffffd88;
  TPZVec<long> *in_stack_fffffffffffffd90;
  ostream *in_stack_fffffffffffffd98;
  ostream *in_stack_fffffffffffffda0;
  stringstream local_1e0 [16];
  ostream local_1d0 [8];
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffe38;
  map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
  *in_stack_fffffffffffffe40;
  TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *in_stack_fffffffffffffe48;
  TPZGeoMesh *in_stack_fffffffffffffe50;
  void **in_stack_fffffffffffffe58;
  TPZGeoElRefLess<pzgeom::TPZGeoPyramid> *in_stack_fffffffffffffe60;
  _Self local_58;
  _Self local_50;
  undefined8 local_48;
  int local_40;
  long local_20;
  
  local_20 = in_RCX;
  TPZGeoElRefLess<pzgeom::TPZGeoPyramid>::TPZGeoElRefLess
            (in_stack_fffffffffffffe60,in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
             in_stack_fffffffffffffe48,in_stack_fffffffffffffe40,in_stack_fffffffffffffe38);
  *in_RDI = *in_RSI;
  *(long *)((long)in_RDI + *(long *)(*in_RDI + -0x60)) = in_RSI[5];
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x47));
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer
            (in_stack_fffffffffffffd60,(TPZAutoPointer<TPZRefPattern> *)in_stack_fffffffffffffd58);
  TPZVec<long>::size((TPZVec<long> *)(local_20 + 0x238));
  local_48 = 0;
  TPZVec<long>::Resize
            (in_stack_fffffffffffffd90,in_stack_fffffffffffffd88,in_stack_fffffffffffffd80);
  for (local_40 = 0; lVar2 = (long)local_40,
      iVar3 = TPZVec<long>::NElements((TPZVec<long> *)(local_20 + 0x238)), lVar2 < iVar3;
      local_40 = local_40 + 1) {
    plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_20 + 0x238),(long)local_40);
    if (*plVar4 == -1) {
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x47),(long)local_40);
      *plVar4 = -1;
    }
    else {
      TPZVec<long>::operator[]((TPZVec<long> *)(local_20 + 0x238),(long)local_40);
      local_50._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::
           find(in_stack_fffffffffffffd58,(key_type_conflict1 *)0x15f8b5b);
      local_58._M_node =
           (_Base_ptr)
           std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>::end
                     (in_stack_fffffffffffffd58);
      bVar1 = std::operator==(&local_50,&local_58);
      if (bVar1) {
        std::__cxx11::stringstream::stringstream(local_1e0);
        poVar5 = std::operator<<(local_1d0,"ERROR in - ");
        poVar5 = std::operator<<(poVar5,
                                 "TPZGeoElRefPattern<pzgeom::TPZGeoPyramid>::TPZGeoElRefPattern(TPZGeoMesh &, const TPZGeoElRefPattern<TGeo> &, std::map<int64_t, int64_t> &, std::map<int64_t, int64_t> &) [TGeo = pzgeom::TPZGeoPyramid]"
                                );
        in_stack_fffffffffffffda0 = std::operator<<(poVar5," subelement ");
        in_stack_fffffffffffffd98 =
             (ostream *)std::ostream::operator<<(in_stack_fffffffffffffda0,local_40);
        poVar5 = std::operator<<(in_stack_fffffffffffffd98," index = ");
        plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(local_20 + 0x238),(long)local_40);
        poVar5 = (ostream *)std::ostream::operator<<(poVar5,*plVar4);
        std::operator<<(poVar5," is not in the map.");
        pzinternal::DebugStopImpl(in_stack_00000180,in_stack_00000178);
        std::__cxx11::stringstream::~stringstream(local_1e0);
      }
      TPZVec<long>::operator[]((TPZVec<long> *)(local_20 + 0x238),(long)local_40);
      pmVar6 = std::map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
               ::operator[]((map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_>
                             *)in_stack_fffffffffffffda0,
                            (key_type_conflict1 *)in_stack_fffffffffffffd98);
      in_stack_fffffffffffffd58 =
           (map<long,_long,_std::less<long>,_std::allocator<std::pair<const_long,_long>_>_> *)
           *pmVar6;
      plVar4 = TPZVec<long>::operator[]((TPZVec<long> *)(in_RDI + 0x47),(long)local_40);
      *plVar4 = (long)in_stack_fffffffffffffd58;
    }
  }
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern(TPZGeoMesh &DestMesh,
											 const TPZGeoElRefPattern<TGeo> &cp,
											 std::map<int64_t,int64_t> &gl2lcNdMap,
											 std::map<int64_t,int64_t> &gl2lcElMap):
TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),TPZGeoElRefLess<TGeo>(DestMesh,cp,gl2lcNdMap,gl2lcElMap),
fRefPattern ( cp.fRefPattern )
{
	int i;
    this->fSubEl.Resize(cp.fSubEl.size(),0);
	for (i=0;i<cp.fSubEl.NElements();i++)
	{
		if (cp.fSubEl[i] == -1)
		{
			this->fSubEl[i] = -1;
			continue;
		}
		if (gl2lcElMap.find(cp.fSubEl[i]) == gl2lcElMap.end())
		{
			std::stringstream sout;
			sout << "ERROR in - " << __PRETTY_FUNCTION__
			<< " subelement " << i << " index = " << cp.fSubEl[i] << " is not in the map.";
#ifdef PZ_LOG
            TPZLogger loggerrefpattern("pz.mesh.tpzgeoelrefpattern");
			LOGPZ_ERROR (loggerrefpattern,sout.str().c_str());
#endif
			DebugStop();
		}
		this->fSubEl[i] = gl2lcElMap[cp.fSubEl[i]];
	}
}